

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerMSL::type_is_pointer(CompilerMSL *this,SPIRType *type)

{
  byte bVar1;
  SPIRType *pSVar2;
  
  if (type->pointer == true) {
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,(type->parent_type).id);
    bVar1 = pSVar2->pointer ^ 1U | pSVar2->pointer_depth < type->pointer_depth;
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompilerMSL::type_is_pointer(const SPIRType &type) const
{
	if (!type.pointer)
		return false;
	auto &parent_type = get<SPIRType>(type.parent_type);
	// Safeguards when we forget to set pointer_depth (there is an assert for it in type_to_glsl),
	// but the extra check shouldn't hurt.
	return (type.pointer_depth > parent_type.pointer_depth) || !parent_type.pointer;
}